

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void YM2608IRQFlagWrite(FM_OPN *OPN,YM2608 *F2608,int v)

{
  int v_local;
  YM2608 *F2608_local;
  FM_OPN *OPN_local;
  
  if ((v & 0x80U) == 0) {
    F2608->flagmask = (byte)v & 0x1f ^ 0xff;
    FM_IRQMASK_SET(&OPN->ST,(uint)(F2608->irqmask & F2608->flagmask));
  }
  else {
    FM_STATUS_RESET(&OPN->ST,0xf7);
  }
  return;
}

Assistant:

INLINE void YM2608IRQFlagWrite(FM_OPN *OPN, YM2608 *F2608, int v)
{
	if( v & 0x80 )
	{   /* Reset IRQ flag */
		FM_STATUS_RESET(&OPN->ST, 0xf7); /* don't touch BUFRDY flag otherwise we'd have to call ymdeltat module to set the flag back */
	}
	else
	{   /* Set status flag mask */
		F2608->flagmask = (~(v&0x1f));
		FM_IRQMASK_SET(&OPN->ST, (F2608->irqmask & F2608->flagmask) );
	}
}